

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::Value::Value(Value *this,Value *param_1)

{
  double dVar1;
  pointer puVar2;
  pointer pVVar3;
  int iVar4;
  
  iVar4 = param_1->int_value_;
  dVar1 = param_1->real_value_;
  this->type_ = param_1->type_;
  this->int_value_ = iVar4;
  this->real_value_ = dVar1;
  std::__cxx11::string::string((string *)&this->string_value_,(string *)&param_1->string_value_);
  puVar2 = (param_1->binary_value_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  (this->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->binary_value_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pVVar3 = (param_1->array_value_).
           super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl
  .super__Vector_impl_data._M_start =
       (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl
  .super__Vector_impl_data._M_finish = pVVar3;
  (this->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->array_value_).super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->object_value_)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->object_value_)._M_t._M_impl.super__Rb_tree_header);
  this->boolean_value_ = param_1->boolean_value_;
  return;
}

Assistant:

char Type() const { return static_cast<char>(type_); }